

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

Array<Qentem::Value<char16_t>_> * __thiscall
Qentem::Array<Qentem::Value<char16_t>_>::operator=
          (Array<Qentem::Value<char16_t>_> *this,Array<Qentem::Value<char16_t>_> *src)

{
  uint uVar1;
  SizeT SVar2;
  Value<char16_t> *item;
  
  if (this != src) {
    item = this->storage_;
    uVar1 = this->index_;
    this->storage_ = (Value<char16_t> *)0x0;
    SVar2 = src->index_;
    this->index_ = SVar2;
    this->capacity_ = SVar2;
    if (SVar2 != 0) {
      copyArray(this,src);
    }
    Memory::Dispose<Qentem::Value<char16_t>>(item,item + uVar1);
    Memory::Deallocate(item);
  }
  return this;
}

Assistant:

Array &operator=(const Array &src) {
        if (this != &src) {
            Type_T     *storage = Storage();
            const SizeT size    = Size();

            clearStorage();
            setSize(src.Size());
            setCapacity(src.Size());

            if (IsNotEmpty()) {
                copyArray(src);
            }

            // Just in case the copied array is not a child array.
            Memory::Dispose(storage, (storage + size));
            Memory::Deallocate(storage);
        }

        return *this;
    }